

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderIndexingTests.cpp
# Opt level: O0

void vkt::sr::anon_unknown_0::evalSubscriptMat2(ShaderEvalContext *c)

{
  VecAccess<float,_4,_2> local_40;
  undefined1 local_30 [8];
  Vector<float,_2> local_28;
  undefined1 local_20 [8];
  Vector<float,_2> local_18;
  ShaderEvalContext *local_10;
  ShaderEvalContext *c_local;
  
  local_10 = c;
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_20,(int)c,0);
  tcu::Vector<float,_4>::swizzle((Vector<float,_4> *)local_30,(int)local_10,1);
  tcu::operator*((tcu *)&local_28,0.5,(Vector<float,_2> *)local_30);
  tcu::operator+((tcu *)&local_18,(Vector<float,_2> *)local_20,&local_28);
  local_40 = tcu::Vector<float,_4>::xy(&local_10->color);
  tcu::VecAccess<float,_4,_2>::operator=(&local_40,&local_18);
  return;
}

Assistant:

void evalSubscriptMat2		(ShaderEvalContext& c) { c.color.xy()	= c.coords.swizzle(0,1) + 0.5f*c.coords.swizzle(1,2); }